

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O2

void __thiscall
HBT_correlation::HBT_correlation
          (HBT_correlation *this,ParameterReader *paraRdr,string *path,
          shared_ptr<RandomUtil::Random> *ran_gen)

{
  vector<double,_std::allocator<double>_> *this_00;
  double ***arr2D;
  uint uVar1;
  unsigned_long_long **ppuVar2;
  unsigned_long_long **ppuVar3;
  double **ppdVar4;
  double **ppdVar5;
  double **ppdVar6;
  double **ppdVar7;
  double *****pppppdVar8;
  double *****pppppdVar9;
  double *****pppppdVar10;
  double *****pppppdVar11;
  double *****pppppdVar12;
  double *****pppppdVar13;
  double ****ppppdVar14;
  double ****ppppdVar15;
  double ****ppppdVar16;
  double ****ppppdVar17;
  double ****ppppdVar18;
  double ****ppppdVar19;
  HBT_correlation *pHVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int i;
  int iVar24;
  int iVar25;
  int j;
  ulong uVar26;
  ulong uVar27;
  int i_3;
  ulong uVar28;
  int k;
  ulong uVar29;
  int k_2;
  int k_1;
  ulong uVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double local_248;
  double ******local_240;
  vector<double,_std::allocator<double>_> *local_238;
  HBT_correlation *local_230;
  vector<double,_std::allocator<double>_> *local_228;
  vector<double,_std::allocator<double>_> *local_220;
  double ******local_218;
  double ******local_210;
  double ******local_208;
  vector<double,_std::allocator<double>_> *local_200;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_1f8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_1f0;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_1e8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_1e0;
  vector<double,_std::allocator<double>_> *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParameterReader::ParameterReader(&this->paraRdr_,paraRdr);
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pretty_ostream::pretty_ostream(&this->messager);
  this_00 = &this->KT_array_;
  local_200 = &this->Kphi_array_;
  local_238 = &this->q_out;
  local_220 = &this->q_side;
  local_228 = &this->q_long;
  local_1e0 = &this->number_of_pairs_numerator_KTdiff;
  local_1e8 = &this->number_of_pairs_denormenator_KTdiff;
  local_1f0 = &this->number_of_pairs_numerator_KTdiff_qinv_;
  local_1f8 = &this->number_of_pairs_denormenator_KTdiff_qinv_;
  (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ran_gen_ptr_).
              super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>,
             &ran_gen->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
  this->long_comoving_boost = false;
  std::__cxx11::string::string((string *)&local_50,"long_comoving_boost",(allocator *)&local_248);
  local_240 = (double ******)ParameterReader::getVal(&this->paraRdr_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (((double)local_240 == 1.0) && (!NAN((double)local_240))) {
    this->long_comoving_boost = true;
  }
  std::__cxx11::string::string((string *)&local_70,"qnpts",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_70);
  this->qnpts = (int)dVar31;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90,"q_min",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_90);
  this->q_min = dVar31;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,"q_max",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_b0);
  this->q_max = dVar31;
  std::__cxx11::string::~string((string *)&local_b0);
  iVar25 = this->qnpts;
  this->delta_q = (this->q_max - this->q_min) / (double)(iVar25 + -1);
  for (iVar24 = 0; iVar24 < iVar25; iVar24 = iVar24 + 1) {
    local_240 = (double ******)(double)iVar24;
    local_248 = this->delta_q * (double)local_240 + this->q_min;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_238,&local_248);
    local_248 = this->delta_q * (double)local_240 + this->q_min;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_220,&local_248);
    local_248 = (double)local_240 * this->delta_q + this->q_min;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_228,&local_248);
    iVar25 = this->qnpts;
  }
  std::__cxx11::string::string((string *)&local_d0,"needed_number_of_pairs",(allocator *)&local_248)
  ;
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_d0);
  this->needed_number_of_pairs =
       (long)(dVar31 - 9.223372036854776e+18) & (long)dVar31 >> 0x3f | (long)dVar31;
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"azimuthal_flag",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_f0);
  this->azimuthal_flag_ = (int)dVar31;
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,"invariant_radius_flag",(allocator *)&local_248)
  ;
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_110);
  this->invariant_radius_flag_ = (int)dVar31;
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"n_KT",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_130);
  this->n_KT = (int)dVar31;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_150,"n_Kphi",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_150);
  this->n_Kphi = (int)dVar31;
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_170,"KT_min",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_170);
  this->KT_min = dVar31;
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_190,"KT_max",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_190);
  this->KT_max = dVar31;
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_1b0,"HBTrap_min",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_1b0);
  this->Krap_min_ = dVar31;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"HBTrap_max",(allocator *)&local_248);
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_1d0);
  this->Krap_max_ = dVar31;
  std::__cxx11::string::~string((string *)&local_1d0);
  auVar32._0_8_ = this->KT_max - this->KT_min;
  iVar25 = this->n_KT;
  auVar33._0_8_ = (double)(iVar25 + -1);
  auVar33._8_8_ = (double)this->n_Kphi;
  auVar32._8_8_ = 0x401921fb54442d18;
  auVar32 = divpd(auVar32,auVar33);
  this->dKT = (double)auVar32._0_8_;
  this->dKphi = (double)auVar32._8_8_;
  for (iVar24 = 0; iVar24 < iVar25; iVar24 = iVar24 + 1) {
    local_248 = (double)iVar24 * this->dKT + this->KT_min;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_248);
    local_248 = 0.0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    emplace_back<unsigned_long_long>(local_1e0,(unsigned_long_long *)&local_248);
    local_248 = 0.0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    emplace_back<unsigned_long_long>(local_1e8,(unsigned_long_long *)&local_248);
    local_248 = 0.0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    emplace_back<unsigned_long_long>(local_1f0,(unsigned_long_long *)&local_248);
    local_248 = 0.0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    emplace_back<unsigned_long_long>(local_1f8,(unsigned_long_long *)&local_248);
    iVar25 = this->n_KT;
  }
  for (iVar25 = 0; iVar25 < this->n_Kphi; iVar25 = iVar25 + 1) {
    local_248 = (double)iVar25 * this->dKphi;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_200,&local_248);
  }
  local_230 = this;
  local_1d8 = this_00;
  if (this->azimuthal_flag_ == 1) {
    create_a_2D_array<unsigned_long_long>
              (this,&this->number_of_pairs_numerator_KTKphidiff,this->n_KT,this->n_Kphi);
    create_a_2D_array<unsigned_long_long>
              (this,&this->number_of_pairs_denormenator_KTKphidiff,this->n_KT,this->n_Kphi);
    uVar21 = 0;
    uVar22 = (ulong)(uint)this->n_Kphi;
    if (this->n_Kphi < 1) {
      uVar22 = uVar21;
    }
    uVar23 = (ulong)(uint)this->n_KT;
    if (this->n_KT < 1) {
      uVar23 = uVar21;
    }
    for (; uVar21 != uVar23; uVar21 = uVar21 + 1) {
      ppuVar2 = this->number_of_pairs_numerator_KTKphidiff;
      ppuVar3 = this->number_of_pairs_denormenator_KTKphidiff;
      for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
        ppuVar2[uVar21][uVar26] = 0;
        ppuVar3[uVar21][uVar26] = 0;
      }
    }
  }
  pHVar20 = local_230;
  local_230->psi_ref = 0.0;
  local_230->number_pairs_num = 0;
  local_230->number_pairs_denorm = 0;
  if (local_230->invariant_radius_flag_ == 1) {
    arr2D = &local_230->q_inv_mean;
    create_a_2D_array<double>(local_230,arr2D,local_230->n_KT,local_230->qnpts);
    create_a_2D_array<double>(pHVar20,&pHVar20->correl_1d_inv_num,pHVar20->n_KT,pHVar20->qnpts);
    create_a_2D_array<double>
              (pHVar20,&pHVar20->correl_1d_inv_num_count,pHVar20->n_KT,pHVar20->qnpts);
    create_a_2D_array<double>(pHVar20,&pHVar20->correl_1d_inv_denorm,pHVar20->n_KT,pHVar20->qnpts);
    uVar21 = 0;
    uVar22 = (ulong)(uint)pHVar20->qnpts;
    if (pHVar20->qnpts < 1) {
      uVar22 = uVar21;
    }
    uVar23 = (ulong)(uint)pHVar20->n_KT;
    if (pHVar20->n_KT < 1) {
      uVar23 = uVar21;
    }
    for (; uVar21 != uVar23; uVar21 = uVar21 + 1) {
      ppdVar4 = *arr2D;
      ppdVar5 = pHVar20->correl_1d_inv_num;
      ppdVar6 = pHVar20->correl_1d_inv_num_count;
      ppdVar7 = pHVar20->correl_1d_inv_denorm;
      for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
        ppdVar4[uVar21][uVar26] = 0.0;
        ppdVar5[uVar21][uVar26] = 0.0;
        ppdVar6[uVar21][uVar26] = 0.0;
        ppdVar7[uVar21][uVar26] = 0.0;
      }
    }
  }
  pHVar20 = local_230;
  if (local_230->azimuthal_flag_ == 0) {
    local_240 = (double ******)&local_230->q_out_mean;
    iVar25 = local_230->qnpts;
    create_a_4D_array<double>
              (local_230,(double *****)local_240,local_230->n_KT,iVar25,iVar25,iVar25);
    local_208 = (double ******)&pHVar20->q_side_mean;
    iVar25 = pHVar20->qnpts;
    create_a_4D_array<double>(pHVar20,(double *****)local_208,pHVar20->n_KT,iVar25,iVar25,iVar25);
    local_210 = (double ******)&pHVar20->q_long_mean;
    iVar25 = pHVar20->qnpts;
    create_a_4D_array<double>(pHVar20,(double *****)local_210,pHVar20->n_KT,iVar25,iVar25,iVar25);
    iVar25 = pHVar20->qnpts;
    create_a_4D_array<double>(pHVar20,&pHVar20->correl_3d_num,pHVar20->n_KT,iVar25,iVar25,iVar25);
    iVar25 = pHVar20->qnpts;
    create_a_4D_array<double>
              (pHVar20,&pHVar20->correl_3d_num_count,pHVar20->n_KT,iVar25,iVar25,iVar25);
    iVar25 = pHVar20->qnpts;
    create_a_4D_array<double>(pHVar20,&pHVar20->correl_3d_denorm,pHVar20->n_KT,iVar25,iVar25,iVar25)
    ;
    uVar1 = pHVar20->qnpts;
    uVar22 = 0;
    uVar21 = 0;
    if (0 < (int)uVar1) {
      uVar21 = (ulong)uVar1;
    }
    uVar23 = (ulong)(uint)pHVar20->n_KT;
    if (pHVar20->n_KT < 1) {
      uVar23 = uVar22;
    }
    for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
      for (uVar26 = 0; uVar26 != uVar21; uVar26 = uVar26 + 1) {
        for (uVar27 = 0; uVar27 != uVar1; uVar27 = uVar27 + 1) {
          ppppdVar14 = (double ****)*local_240;
          ppppdVar15 = (double ****)*local_208;
          ppppdVar16 = (double ****)*local_210;
          ppppdVar17 = pHVar20->correl_3d_num;
          ppppdVar18 = pHVar20->correl_3d_num_count;
          ppppdVar19 = pHVar20->correl_3d_denorm;
          for (uVar28 = 0; uVar1 != uVar28; uVar28 = uVar28 + 1) {
            ppppdVar14[uVar22][uVar26][uVar27][uVar28] = 0.0;
            ppppdVar15[uVar22][uVar26][uVar27][uVar28] = 0.0;
            ppppdVar16[uVar22][uVar26][uVar27][uVar28] = 0.0;
            ppppdVar17[uVar22][uVar26][uVar27][uVar28] = 0.0;
            ppppdVar18[uVar22][uVar26][uVar27][uVar28] = 0.0;
            ppppdVar19[uVar22][uVar26][uVar27][uVar28] = 0.0;
          }
        }
      }
    }
  }
  else {
    local_240 = &local_230->q_out_diff_mean;
    iVar25 = local_230->qnpts;
    create_a_5D_array<double>
              (local_230,local_240,local_230->n_KT,local_230->n_Kphi,iVar25,iVar25,iVar25);
    local_208 = &pHVar20->q_side_diff_mean;
    iVar25 = pHVar20->qnpts;
    create_a_5D_array<double>(pHVar20,local_208,pHVar20->n_KT,pHVar20->n_Kphi,iVar25,iVar25,iVar25);
    local_210 = &pHVar20->q_long_diff_mean;
    iVar25 = pHVar20->qnpts;
    create_a_5D_array<double>(pHVar20,local_210,pHVar20->n_KT,pHVar20->n_Kphi,iVar25,iVar25,iVar25);
    local_218 = &pHVar20->correl_3d_Kphi_diff_num;
    iVar25 = pHVar20->qnpts;
    create_a_5D_array<double>(pHVar20,local_218,pHVar20->n_KT,pHVar20->n_Kphi,iVar25,iVar25,iVar25);
    iVar25 = pHVar20->qnpts;
    create_a_5D_array<double>
              (pHVar20,&pHVar20->correl_3d_Kphi_diff_num_count,pHVar20->n_KT,pHVar20->n_Kphi,iVar25,
               iVar25,iVar25);
    iVar25 = pHVar20->qnpts;
    create_a_5D_array<double>
              (pHVar20,&pHVar20->correl_3d_Kphi_diff_denorm,pHVar20->n_KT,pHVar20->n_Kphi,iVar25,
               iVar25,iVar25);
    uVar21 = 0;
    uVar22 = (ulong)(uint)pHVar20->n_Kphi;
    if (pHVar20->n_Kphi < 1) {
      uVar22 = uVar21;
    }
    uVar23 = (ulong)(uint)pHVar20->n_KT;
    if (pHVar20->n_KT < 1) {
      uVar23 = uVar21;
    }
    for (; uVar21 != uVar23; uVar21 = uVar21 + 1) {
      uVar1 = local_230->qnpts;
      uVar26 = 0;
      if (0 < (int)uVar1) {
        uVar26 = (ulong)uVar1;
      }
      for (uVar27 = 0; uVar27 != uVar22; uVar27 = uVar27 + 1) {
        for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
          for (uVar29 = 0; uVar29 != uVar1; uVar29 = uVar29 + 1) {
            pppppdVar8 = *local_240;
            pppppdVar9 = *local_208;
            pppppdVar10 = *local_210;
            pppppdVar11 = *local_218;
            pppppdVar12 = pHVar20->correl_3d_Kphi_diff_num_count;
            pppppdVar13 = pHVar20->correl_3d_Kphi_diff_denorm;
            for (uVar30 = 0; uVar1 != uVar30; uVar30 = uVar30 + 1) {
              pppppdVar8[uVar21][uVar27][uVar28][uVar29][uVar30] = 0.0;
              pppppdVar9[uVar21][uVar27][uVar28][uVar29][uVar30] = 0.0;
              pppppdVar10[uVar21][uVar27][uVar28][uVar29][uVar30] = 0.0;
              pppppdVar11[uVar21][uVar27][uVar28][uVar29][uVar30] = 0.0;
              pppppdVar12[uVar21][uVar27][uVar28][uVar29][uVar30] = 0.0;
              pppppdVar13[uVar21][uVar27][uVar28][uVar29][uVar30] = 0.0;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

HBT_correlation::HBT_correlation(
    ParameterReader &paraRdr, std::string path,
    std::shared_ptr<RandomUtil::Random> ran_gen)
    : paraRdr_(paraRdr), path_(path) {
    ran_gen_ptr_ = ran_gen;

    long_comoving_boost = false;
    if (paraRdr_.getVal("long_comoving_boost") == 1) long_comoving_boost = true;

    qnpts = paraRdr_.getVal("qnpts");
    q_min = paraRdr_.getVal("q_min");
    q_max = paraRdr_.getVal("q_max");
    delta_q = (q_max - q_min) / (qnpts - 1);

    for (int i = 0; i < qnpts; i++) {
        q_out.push_back(q_min + i * delta_q);
        q_side.push_back(q_min + i * delta_q);
        q_long.push_back(q_min + i * delta_q);
    }

    needed_number_of_pairs = paraRdr_.getVal("needed_number_of_pairs");

    azimuthal_flag_ = paraRdr_.getVal("azimuthal_flag");
    invariant_radius_flag_ = paraRdr_.getVal("invariant_radius_flag");

    n_KT = paraRdr_.getVal("n_KT");
    n_Kphi = paraRdr_.getVal("n_Kphi");
    KT_min = paraRdr_.getVal("KT_min");
    KT_max = paraRdr_.getVal("KT_max");
    Krap_min_ = paraRdr_.getVal("HBTrap_min");
    Krap_max_ = paraRdr_.getVal("HBTrap_max");

    dKT = (KT_max - KT_min) / (n_KT - 1);
    dKphi = 2 * M_PI / n_Kphi;  // does not need 0 and 2*pi

    for (int i = 0; i < n_KT; i++) {
        KT_array_.push_back(KT_min + i * dKT);
        number_of_pairs_numerator_KTdiff.push_back(0);
        number_of_pairs_denormenator_KTdiff.push_back(0);
        number_of_pairs_numerator_KTdiff_qinv_.push_back(0);
        number_of_pairs_denormenator_KTdiff_qinv_.push_back(0);
    }

    for (int i = 0; i < n_Kphi; i++) {
        Kphi_array_.push_back(i * dKphi);
    }

    if (azimuthal_flag_ == 1) {
        create_a_2D_array(number_of_pairs_numerator_KTKphidiff, n_KT, n_Kphi);
        create_a_2D_array(
            number_of_pairs_denormenator_KTKphidiff, n_KT, n_Kphi);
        for (int i = 0; i < n_KT; i++) {
            for (int j = 0; j < n_Kphi; j++) {
                number_of_pairs_numerator_KTKphidiff[i][j] = 0;
                number_of_pairs_denormenator_KTKphidiff[i][j] = 0;
            }
        }
    }

    number_pairs_num = 0;
    number_pairs_denorm = 0;
    psi_ref = 0.;

    if (invariant_radius_flag_ == 1) {
        create_a_2D_array(q_inv_mean, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_num, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_num_count, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_denorm, n_KT, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int k = 0; k < qnpts; k++) {
                q_inv_mean[iK][k] = 0.0;
                correl_1d_inv_num[iK][k] = 0.0;
                correl_1d_inv_num_count[iK][k] = 0.0;
                correl_1d_inv_denorm[iK][k] = 0.0;
            }
        }
    }

    if (azimuthal_flag_ == 0) {
        create_a_4D_array(q_out_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(q_side_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(q_long_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_num, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_num_count, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_denorm, n_KT, qnpts, qnpts, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int i = 0; i < qnpts; i++) {
                for (int j = 0; j < qnpts; j++) {
                    for (int k = 0; k < qnpts; k++) {
                        q_out_mean[iK][i][j][k] = 0.0;
                        q_side_mean[iK][i][j][k] = 0.0;
                        q_long_mean[iK][i][j][k] = 0.0;
                        correl_3d_num[iK][i][j][k] = 0.0;
                        correl_3d_num_count[iK][i][j][k] = 0.0;
                        correl_3d_denorm[iK][i][j][k] = 0.0;
                    }
                }
            }
        }
    } else {
        create_a_5D_array(q_out_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(q_side_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(q_long_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_num, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_num_count, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_denorm, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int iphi = 0; iphi < n_Kphi; iphi++) {
                for (int i = 0; i < qnpts; i++) {
                    for (int j = 0; j < qnpts; j++) {
                        for (int k = 0; k < qnpts; k++) {
                            q_out_diff_mean[iK][iphi][i][j][k] = 0.0;
                            q_side_diff_mean[iK][iphi][i][j][k] = 0.0;
                            q_long_diff_mean[iK][iphi][i][j][k] = 0.0;
                            correl_3d_Kphi_diff_num[iK][iphi][i][j][k] = 0.0;
                            correl_3d_Kphi_diff_num_count[iK][iphi][i][j][k] =
                                0.0;
                            correl_3d_Kphi_diff_denorm[iK][iphi][i][j][k] = 0.0;
                        }
                    }
                }
            }
        }
    }
}